

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendFuncCase::iterate(BlendFuncCase *this)

{
  GLenum *pGVar1;
  GLenum *pGVar2;
  int *piVar3;
  TestLog *pTVar4;
  int iVar5;
  GLenum err;
  undefined4 extraout_var;
  int ndx;
  undefined4 *puVar6;
  GLuint GVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  deInt32 maxDrawBuffers;
  allocator<char> local_e2;
  allocator<char> local_e1;
  ScopedLogSection section;
  CallLogWrapper gl;
  string local_c0;
  string local_a0;
  ResultCollector result;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0," // ERROR: ",(allocator<char> *)&local_a0);
  tcu::ResultCollector::ResultCollector(&result,pTVar4,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  maxDrawBuffers = 0;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8824,&maxDrawBuffers);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x428);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Initial",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Initial value",&local_e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c9,iVar5,1,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c8,iVar5,0,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80cb,iVar5,1,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80ca,iVar5,0,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingCommon",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting common",&local_e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  glu::CallLogWrapper::glBlendFunc(&gl,0x302,0x304);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c9,iVar5,0x302,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c8,iVar5,0x304,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80cb,iVar5,0x302,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80ca,iVar5,0x304,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingCommonSeparate",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting common separate",&local_e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  glu::CallLogWrapper::glBlendFuncSeparate(&gl,0x300,0x303,0x306,0x305);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c9,iVar5,0x300,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c8,iVar5,0x303,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80cb,iVar5,0x306,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80ca,iVar5,0x305,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingIndexed",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting indexed",&local_e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar8 = &DAT_018b4eb0;
  puVar6 = &DAT_018b4eb4;
  uVar10 = 1;
  uVar9 = 0;
  while( true ) {
    GVar7 = (GLuint)uVar9;
    if (maxDrawBuffers <= (int)GVar7) break;
    pGVar1 = puVar8 + (uVar9 / 0xf) * -0xf;
    uVar9 = uVar9 + 1;
    pGVar2 = puVar6 + (uVar10 / 0xf) * -0xf;
    puVar8 = puVar8 + 1;
    puVar6 = puVar6 + 1;
    uVar10 = uVar10 + 1;
    glu::CallLogWrapper::glBlendFunci(&gl,GVar7,*pGVar1,*pGVar2);
  }
  puVar6 = &DAT_018b4eb0;
  uVar10 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar10) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c9,(int)uVar10,puVar6[(uVar10 / 0xf) * -0xf],this->m_verifierType);
    uVar10 = uVar10 + 1;
    puVar6 = puVar6 + 1;
  }
  puVar6 = &DAT_018b4eb4;
  uVar10 = 1;
  iVar5 = 0;
  while( true ) {
    if (maxDrawBuffers <= iVar5) break;
    piVar3 = puVar6 + (uVar10 / 0xf) * -0xf;
    puVar6 = puVar6 + 1;
    uVar10 = uVar10 + 1;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c8,iVar5,*piVar3,this->m_verifierType);
    iVar5 = iVar5 + 1;
  }
  puVar6 = &DAT_018b4eb0;
  uVar10 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar10) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80cb,(int)uVar10,puVar6[(uVar10 / 0xf) * -0xf],this->m_verifierType);
    uVar10 = uVar10 + 1;
    puVar6 = puVar6 + 1;
  }
  puVar6 = &DAT_018b4eb4;
  uVar10 = 1;
  iVar5 = 0;
  while( true ) {
    if (maxDrawBuffers <= iVar5) break;
    piVar3 = puVar6 + (uVar10 / 0xf) * -0xf;
    puVar6 = puVar6 + 1;
    uVar10 = uVar10 + 1;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80ca,iVar5,*piVar3,this->m_verifierType);
    iVar5 = iVar5 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingIndexedSeparate",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting indexed separate",&local_e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar6 = &DAT_018b4eb4;
  uVar10 = 1;
  uVar9 = 0;
  puVar8 = &DAT_018b4eb0;
  while( true ) {
    GVar7 = (GLuint)uVar9;
    if (maxDrawBuffers <= (int)GVar7) break;
    pGVar2 = puVar6 + (uVar10 / 0xf) * -0xf;
    pGVar1 = puVar8 + (uVar9 / 0xf) * -0xf;
    puVar8 = puVar8 + 1;
    uVar9 = uVar9 + 1;
    puVar6 = puVar6 + 1;
    uVar10 = uVar10 + 1;
    glu::CallLogWrapper::glBlendFuncSeparatei
              (&gl,GVar7,(&DAT_018b4eb0)[(int)(GVar7 + 3) % 0xf],
               (&DAT_018b4eb0)[(int)(GVar7 + 2) % 0xf],*pGVar2,*pGVar1);
  }
  puVar6 = &DAT_018b4eb0;
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c9,iVar5,(&DAT_018b4eb0)[(iVar5 + 3) % 0xf],this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c8,iVar5,(&DAT_018b4eb0)[(iVar5 + 2) % 0xf],this->m_verifierType);
  }
  puVar8 = &DAT_018b4eb4;
  uVar10 = 1;
  iVar5 = 0;
  while( true ) {
    if (maxDrawBuffers <= iVar5) break;
    piVar3 = puVar8 + (uVar10 / 0xf) * -0xf;
    puVar8 = puVar8 + 1;
    uVar10 = uVar10 + 1;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80cb,iVar5,*piVar3,this->m_verifierType);
    iVar5 = iVar5 + 1;
  }
  uVar10 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar10) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80ca,(int)uVar10,puVar6[(uVar10 / 0xf) * -0xf],this->m_verifierType);
    uVar10 = uVar10 + 1;
    puVar6 = puVar6 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterResettingIndexedWithCommon",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After resetting indexed with common",&local_e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar8 = &DAT_018b4eb0;
  puVar6 = &DAT_018b4eb4;
  uVar10 = 1;
  uVar9 = 0;
  while( true ) {
    GVar7 = (GLuint)uVar9;
    if (maxDrawBuffers <= (int)GVar7) break;
    pGVar1 = puVar8 + (uVar9 / 0xf) * -0xf;
    uVar9 = uVar9 + 1;
    pGVar2 = puVar6 + (uVar10 / 0xf) * -0xf;
    puVar8 = puVar8 + 1;
    puVar6 = puVar6 + 1;
    uVar10 = uVar10 + 1;
    glu::CallLogWrapper::glBlendFunci(&gl,GVar7,*pGVar1,*pGVar2);
  }
  glu::CallLogWrapper::glBlendFunc(&gl,0x302,0x304);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c9,iVar5,0x302,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c8,iVar5,0x304,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80cb,iVar5,0x302,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80ca,iVar5,0x304,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterResettingIndexedWithCommonSeparate",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After resetting indexed with common separate",&local_e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  glu::CallLogWrapper::glBlendFuncSeparate(&gl,0x300,0x303,0x306,0x305);
  puVar6 = &DAT_018b4eb4;
  uVar10 = 1;
  uVar9 = 0;
  puVar8 = &DAT_018b4eb0;
  while( true ) {
    GVar7 = (GLuint)uVar9;
    if (maxDrawBuffers <= (int)GVar7) break;
    pGVar2 = puVar6 + (uVar10 / 0xf) * -0xf;
    pGVar1 = puVar8 + (uVar9 / 0xf) * -0xf;
    puVar8 = puVar8 + 1;
    uVar9 = uVar9 + 1;
    puVar6 = puVar6 + 1;
    uVar10 = uVar10 + 1;
    glu::CallLogWrapper::glBlendFuncSeparatei
              (&gl,GVar7,(&DAT_018b4eb0)[(int)(GVar7 + 3) % 0xf],
               (&DAT_018b4eb0)[(int)(GVar7 + 2) % 0xf],*pGVar2,*pGVar1);
  }
  glu::CallLogWrapper::glBlendFuncSeparate(&gl,0x300,0x303,0x306,0x305);
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c9,iVar5,0x300,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80c8,iVar5,0x303,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80cb,iVar5,0x306,this->m_verifierType);
  }
  for (iVar5 = 0; iVar5 < maxDrawBuffers; iVar5 = iVar5 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x80ca,iVar5,0x305,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BlendFuncCase::IterateResult BlendFuncCase::iterate (void)
{
	const deUint32 blendFuncs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_ONE, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ZERO, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_ONE, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ZERO, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_DST_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommonSeparate", "After setting common separate");

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ONE_MINUS_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_DST_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ONE_MINUS_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFunci(ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexedSeparate", "After setting indexed separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFuncSeparatei(ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFunci(ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		gl.glBlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_DST_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommonSeparate", "After resetting indexed with common separate");

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFuncSeparatei(ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ONE_MINUS_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_DST_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ONE_MINUS_DST_ALPHA, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}